

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

shared_ptr<SchemePair> __thiscall SchemeVector::to_list(SchemeVector *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  SchemeObject SVar2;
  _func_int **pp_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  __normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>
  __tmp;
  shared_ptr<SchemeObject> *__args;
  undefined1 auVar4 [16];
  shared_ptr<SchemePair> sVar5;
  undefined1 local_49;
  SchemeObject local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if (scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pp_Var3 = (_func_int **)0x0;
  }
  else {
    auVar4 = __dynamic_cast(scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,&SchemeObject::typeinfo,&SchemePair::typeinfo,0);
    in_RDX._M_pi = auVar4._8_8_;
    pp_Var3 = auVar4._0_8_;
  }
  if (pp_Var3 == (_func_int **)0x0) {
    (this->super_SchemeObject)._vptr_SchemeObject = (_func_int **)0x0;
    (this->vec).
    super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    (this->super_SchemeObject)._vptr_SchemeObject = pp_Var3;
    _Var1 = scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    (this->vec).
    super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      }
    }
  }
  __args = *(shared_ptr<SchemeObject> **)(in_RSI + 0x10);
  if (__args != *(shared_ptr<SchemeObject> **)(in_RSI + 8)) {
    do {
      __args = __args + -1;
      local_48._vptr_SchemeObject = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SchemePair,std::allocator<SchemePair>,std::shared_ptr<SchemeObject>const&,std::shared_ptr<SchemePair>&>
                (a_Stack_40,(SchemePair **)&local_48,(allocator<SchemePair> *)&local_49,__args,
                 (shared_ptr<SchemePair> *)this);
      _Var1._M_pi = a_Stack_40[0]._M_pi;
      SVar2._vptr_SchemeObject = local_48._vptr_SchemeObject;
      local_48._vptr_SchemeObject = (_func_int **)0x0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (this->vec).
                super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->super_SchemeObject)._vptr_SchemeObject = SVar2._vptr_SchemeObject;
      (this->vec).
      super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var1._M_pi;
      in_RDX._M_pi = extraout_RDX;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        in_RDX._M_pi = extraout_RDX_00;
      }
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
        in_RDX._M_pi = extraout_RDX_01;
      }
    } while (__args != *(shared_ptr<SchemeObject> **)(in_RSI + 8));
  }
  sVar5.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar5.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SchemePair>)sVar5.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemePair> SchemeVector::to_list() const
{
    auto l = std::dynamic_pointer_cast<SchemePair>(scheme_nil);
    for(auto it=vec.rbegin(); it != vec.rend(); ++it)
    {
        l = std::make_shared<SchemePair>(*it, l);
    }
    return l;
}